

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O2

void pnga_print_file(FILE *file,Integer g_a)

{
  long lVar1;
  Integer ndim;
  Integer type;
  Integer lo [7];
  Integer dims [7];
  
  pnga_inquire(g_a,&type,&ndim,dims);
  for (lVar1 = 0; lVar1 < ndim; lVar1 = lVar1 + 1) {
    lo[lVar1] = 1;
  }
  pnga_print_patch_file(file,g_a,lo,dims,1);
  return;
}

Assistant:

void pnga_print_file(FILE *file, Integer g_a)
{
    Integer i;
    Integer type, ndim, dims[MAXDIM];
    Integer lo[MAXDIM];
    Integer pretty = 1;

    pnga_inquire(g_a, &type, &ndim, dims);

    for(i=0; i<ndim; i++) lo[i] = 1;

    pnga_print_patch_file(file, g_a, lo, dims, pretty);
}